

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O3

int libtorrent::merkle_num_layers(int leaves)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = 0;
  if (1 < leaves) {
    iVar2 = 0;
    do {
      iVar2 = iVar2 + 1;
      bVar1 = 3 < (uint)leaves;
      leaves = (uint)leaves >> 1;
    } while (bVar1);
  }
  return iVar2;
}

Assistant:

int merkle_num_layers(int leaves)
	{
		// leaves must be a power of 2
		TORRENT_ASSERT((leaves & (leaves - 1)) == 0);
		int layers = 0;
		while (leaves > 1)
		{
			++layers;
			leaves >>= 1;
		}
		return layers;
	}